

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O0

void __thiscall
pstack::Procman::CodeLocation::CodeLocation(CodeLocation *this,sptr *info,Phdr *phdr,Addr off)

{
  Addr off_local;
  Phdr *phdr_local;
  sptr *info_local;
  CodeLocation *this_local;
  
  this->location_ = off;
  std::shared_ptr<pstack::Dwarf::Info>::shared_ptr(&this->dwarf_,info);
  this->phdr_ = phdr;
  this->cie_ = (CIE *)0x0;
  this->fde_ = (FDE *)0x0;
  this->cfi_ = (CFI *)0x0;
  pstack::Dwarf::CallFrame::CallFrame(&this->frame_);
  Dwarf::DIE::DIE(&this->die_);
  std::
  optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::optional(&this->symbol_);
  return;
}

Assistant:

CodeLocation::CodeLocation(Dwarf::Info::sptr info, const Elf::Phdr *phdr, Elf::Addr off)
    : location_(off)
    , dwarf_(std::move(info)), phdr_(phdr), cie_(nullptr), fde_(nullptr), cfi_(nullptr)
{
}